

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O3

void __thiscall
FIX::HttpConnection::showRow
          (HttpConnection *this,stringstream *s,string *name,bool value,string *url)

{
  size_type *psVar1;
  ostream *poVar2;
  A *pAVar3;
  ostream *stream;
  int iVar4;
  TD td;
  CENTER center;
  stringstream href;
  A a;
  TR tr;
  long *local_8d0;
  long local_8c8;
  long local_8c0 [2];
  string local_8b0;
  undefined1 local_890 [432];
  ostream *local_6e0;
  TAG local_6d8;
  stringstream local_520 [16];
  ostream local_510 [112];
  ios_base local_4a0 [264];
  TAG local_398;
  TAG local_1e0;
  
  stream = (ostream *)(s + 0x10);
  HTML::TR::TR((TR *)&local_1e0,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_1e0.m_stream,">",1);
  HTML::TD::TD((TD *)local_890,stream);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_890 + 0x38),(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(local_6e0,">",1);
  HTML::TAG::~TAG((TAG *)local_890);
  HTML::TD::TD((TD *)local_890,stream);
  iVar4 = 0x1c0318;
  if (value) {
    iVar4 = 0x1c0314;
  }
  psVar1 = &local_6d8.m_tag._M_string_length;
  local_6d8._vptr_TAG = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6d8,iVar4,iVar4 + (uint)value + 2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_890 + 0x38),(char *)local_6d8._vptr_TAG,
             (long)local_6d8.m_tag._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(local_6e0,">",1);
  if (local_6d8._vptr_TAG != (_func_int **)psVar1) {
    operator_delete(local_6d8._vptr_TAG,local_6d8.m_tag._M_string_length + 1);
  }
  HTML::TAG::~TAG((TAG *)local_890);
  HTML::TD::TD((TD *)local_890,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_6e0,">",1);
  HTML::CENTER::CENTER((CENTER *)&local_6d8,stream);
  std::__ostream_insert<char,std::char_traits<char>>(local_6d8.m_stream,">",1);
  if (url->_M_string_length != 0) {
    std::__cxx11::stringstream::stringstream(local_520);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_510,(url->_M_dataplus)._M_p,url->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"&",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=",1);
    std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    HTML::A::A((A *)&local_398,stream);
    std::__cxx11::stringbuf::str();
    pAVar3 = HTML::A::href((A *)&local_398,&local_8b0);
    local_8d0 = local_8c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"toggle","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(pAVar3->super_TAG).field_0x38,(char *)local_8d0,local_8c8);
    std::__ostream_insert<char,std::char_traits<char>>((pAVar3->super_TAG).m_stream,">",1);
    if (local_8d0 != local_8c0) {
      operator_delete(local_8d0,local_8c0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
      operator_delete(local_8b0._M_dataplus._M_p,local_8b0.field_2._M_allocated_capacity + 1);
    }
    HTML::TAG::~TAG(&local_398);
    std::__cxx11::stringstream::~stringstream(local_520);
    std::ios_base::~ios_base(local_4a0);
  }
  HTML::TAG::~TAG(&local_6d8);
  HTML::TAG::~TAG((TAG *)local_890);
  HTML::TAG::~TAG(&local_1e0);
  return;
}

Assistant:

void HttpConnection::showRow
( std::stringstream& s, const std::string& name, bool value, const std::string& url )
{
    { TR tr(s); tr.text();
      { TD td(s); td.text(name); }
      { TD td(s); td.text(value ? "yes" : "no"); }
      { TD td(s); td.text();
        CENTER center(s); center.text();
        if( url.size() )
        {
          std::stringstream href;
          href << url << "&" << name << "=" << !value;
          A a(s); a.href(href.str()).text("toggle");
        }
      }
    }
}